

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O2

int psmem_mwr(nettlp *nt,tlp_mr_hdr *mh,void *m,size_t count,void *arg)

{
  int iVar1;
  uintptr_t uVar2;
  ulong uVar3;
  
  uVar2 = tlp_mr_addr(mh);
  if (nostdout == 0) {
    fprintf(_stdout,"%s: MWr to 0x%lx, tag 0x%02x, %lu byte\n","psmem_mwr",uVar2,(ulong)mh->tag,
            count);
  }
  uVar3 = *arg;
  if ((uVar2 < uVar3) || (*(long *)((long)arg + 8) + uVar3 < uVar2 + count)) {
    fprintf(_stderr,"%s:ERR: MWr request to 0x%lx, stick out of the pseudo memory region\n",
            "psmem_mwr",uVar2);
    iVar1 = -1;
  }
  else {
    if ((nohex == '\0') && ((nostdout & 1) == 0)) {
      hexdump(m,(int)count);
      uVar3 = *arg;
    }
    memcpy((void *)((uVar2 - uVar3) + *(long *)((long)arg + 0x10)),m,count);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int psmem_mwr(struct nettlp *nt, struct tlp_mr_hdr *mh,
	     void *m, size_t count, void *arg)
{
	struct psmem *p = arg;
	uintptr_t addr;
	
	addr = tlp_mr_addr(mh);
	
	pr_info("MWr to 0x%lx, tag 0x%02x, %lu byte\n", addr, mh->tag, count);

	if (addr < p->addr || addr + count > p->addr + p->size) {
		pr_err("MWr request to 0x%lx, "
		       "stick out of the pseudo memory region\n", addr);
		send_cpl_abort(nt, mh);
		return -1;
	}

	if (!nohex && !nostdout)
		hexdump(m, count);

	memcpy(p->mem + (addr - p->addr), m, count);

	return 0;
}